

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O0

unsigned_long __thiscall
libdivide::divider<unsigned_long,_(libdivide::Branching)1>::recover
          (divider<unsigned_long,_(libdivide::Branching)1> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *in_RDI;
  uint64_t full_q;
  int dr_exceeds_d;
  uint64_t dr_hi;
  uint64_t dr_lo;
  uint64_t half_q;
  uint64_t r_lo;
  uint64_t r_hi;
  uint64_t d_lo;
  uint64_t d_hi;
  uint64_t half_n_lo;
  uint64_t half_n_hi;
  uint8_t shift;
  uint8_t more;
  __uint128_t remainder;
  uint64_t res;
  __uint128_t vfull;
  __uint128_t ufull;
  bool local_fa;
  ulong local_c0;
  long local_b8;
  ulong local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  long local_98;
  byte local_8a;
  byte local_89;
  unsigned_long local_80;
  long local_70;
  ulong local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong *local_30;
  long *local_28;
  ulong local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_89 = (byte)in_RDI[1];
  local_8a = local_89 & 0x3f;
  if (*in_RDI == 0) {
    local_80 = 1L << (local_8a + 1 & 0x3f);
  }
  else {
    local_98 = 1L << local_8a;
    local_a0 = 0;
    local_a8 = 1;
    local_b0 = *in_RDI;
    local_10 = 0;
    local_18 = 1;
    local_28 = &local_b8;
    local_30 = &local_c0;
    local_48 = 0;
    local_50 = 1;
    local_58 = local_b0;
    local_40 = local_98;
    local_20 = local_b0;
    local_8 = local_98;
    local_60 = __udivti3(0,local_98,local_b0,1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_58;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_60;
    uVar3 = SUB168(auVar1 * auVar2,0);
    local_70 = (local_40 - (SUB168(auVar1 * auVar2,8) + local_50 * local_60)) -
               (ulong)(local_48 < uVar3);
    *local_30 = local_48 - uVar3;
    *local_28 = local_70;
    uVar3 = local_b8 * 2 + (ulong)(local_c0 * 2 < local_c0);
    local_fa = true;
    if (uVar3 < 2) {
      local_fa = uVar3 == 1 && local_b0 <= local_c0 * 2;
    }
    local_80 = local_60 * 2 + (long)(int)(uint)local_fa + 1;
  }
  return local_80;
}

Assistant:

T recover() const { return div.recover(); }